

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O3

bool __thiscall
el::base::TypedConfigurations::unsafeValidateFileRolling
          (TypedConfigurations *this,Level level,PreRollOutCallback *preRollOutCallback)

{
  fstream_t *fs;
  pointer pcVar1;
  bool bVar2;
  shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>_> *psVar3;
  unsigned_long uVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  undefined8 uVar6;
  string fname;
  size_t local_60;
  char *local_58;
  char *local_50 [2];
  char local_40 [16];
  
  psVar3 = unsafeGetConfigByRef<std::shared_ptr<std::fstream>>
                     (this,level,&this->m_fileStreamMap,"fileStream");
  fs = (psVar3->
       super___shared_ptr<std::basic_fstream<char,_std::char_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
       )._M_ptr;
  bVar2 = true;
  if (fs != (fstream_t *)0x0) {
    uVar4 = unsafeGetConfigByVal<unsigned_long>
                      (this,level,&this->m_maxLogFileSizeMap,"maxLogFileSize");
    local_60 = utils::File::getSizeOfFile(fs);
    if (uVar4 - 1 < local_60) {
      pbVar5 = unsafeGetConfigByRef<std::__cxx11::string>
                         (this,level,&this->m_filenameMap,"filename");
      pcVar1 = (pbVar5->_M_dataplus)._M_p;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,pcVar1,pcVar1 + pbVar5->_M_string_length);
      std::fstream::close();
      local_58 = local_50[0];
      if ((preRollOutCallback->super__Function_base)._M_manager == (_Manager_type)0x0) {
        uVar6 = std::__throw_bad_function_call();
        if (local_50[0] != local_40) {
          operator_delete(local_50[0]);
        }
        _Unwind_Resume(uVar6);
      }
      (*preRollOutCallback->_M_invoker)((_Any_data *)preRollOutCallback,&local_58,&local_60);
      std::fstream::open((string *)fs,(_Ios_Openmode)local_50);
      if (local_50[0] != local_40) {
        operator_delete(local_50[0]);
      }
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  return bVar2;
}

Assistant:

bool TypedConfigurations::unsafeValidateFileRolling(Level level, const PreRollOutCallback& preRollOutCallback) {
  base::type::fstream_t* fs = unsafeGetConfigByRef(level, &m_fileStreamMap, "fileStream").get();
  if (fs == nullptr) {
    return true;
  }
  std::size_t maxLogFileSize = unsafeGetConfigByVal(level, &m_maxLogFileSizeMap, "maxLogFileSize");
  std::size_t currFileSize = base::utils::File::getSizeOfFile(fs);
  if (maxLogFileSize != 0 && currFileSize >= maxLogFileSize) {
    std::string fname = unsafeGetConfigByRef(level, &m_filenameMap, "filename");
    ELPP_INTERNAL_INFO(1, "Truncating log file [" << fname << "] as a result of configurations for level ["
                       << LevelHelper::convertToString(level) << "]");
    fs->close();
    preRollOutCallback(fname.c_str(), currFileSize);
    fs->open(fname, std::fstream::out | std::fstream::trunc);
    return true;
  }
  return false;
}